

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shrinkable.hpp
# Opt level: O1

Shrinkable<int> * __thiscall
rc::Shrinkable<int>::operator=(Shrinkable<int> *this,Shrinkable<int> *other)

{
  (*other->m_impl->_vptr_IShrinkableImpl[2])();
  if (this->m_impl != (IShrinkableImpl *)0x0) {
    (*this->m_impl->_vptr_IShrinkableImpl[3])();
  }
  this->m_impl = other->m_impl;
  return this;
}

Assistant:

Shrinkable<T> &Shrinkable<T>::operator=(const Shrinkable &other) noexcept {
  other.m_impl->retain();
  if (m_impl) {
    m_impl->release();
  }
  m_impl = other.m_impl;
  return *this;
}